

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeachCli.hpp
# Opt level: O0

void __thiscall peach::cli::PeachCli::executeProgram(PeachCli *this,ifstream *ifs,ostream *os)

{
  undefined8 this_00;
  int iVar1;
  element_type *peVar2;
  void *this_01;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  exception *e;
  unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *local_a0;
  TokenIterator local_98;
  undefined1 local_90 [8];
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  tokens;
  allocator<char> local_61;
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  undefined1 local_40 [8];
  string programText;
  ostream *os_local;
  ifstream *ifs_local;
  PeachCli *this_local;
  
  programText.field_2._8_8_ = os;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_50,(istream_type *)ifs);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_60);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_50._0_8_;
  __beg._M_c = local_50._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_60._0_8_;
  __end._M_c = local_60._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)local_40,__beg,__end,&local_61);
  std::allocator<char>::~allocator(&local_61);
  fsm::FsmCollection::tokenizeText
            ((vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
              *)local_90,&this->tokenizator_,(string *)local_40,&this->keywords_);
  local_98._M_current =
       (unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *)
       std::
       vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
       ::begin((vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
                *)local_90);
  local_a0 = (unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *)
             std::
             vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ::end((vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
                    *)local_90);
  interpreter::Interpreter::interpretateLines(&this->interpreter_,local_98,(TokenIterator)local_a0);
  this_00 = programText.field_2._8_8_;
  interpreter::Interpreter::getInterpretationResult((Interpreter *)&e);
  peVar2 = std::
           __shared_ptr_access<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&e);
  iVar1 = (**peVar2->_vptr_Expression)(peVar2,&this->scope_);
  this_01 = (void *)std::ostream::operator<<((void *)this_00,iVar1);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<peach::expression::Expression>::~shared_ptr
            ((shared_ptr<peach::expression::Expression> *)&e);
  std::
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  ::~vector((vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void executeProgram(std::ifstream &ifs, std::ostream &os)
    {
        std::string programText((std::istreambuf_iterator<char>(ifs)),
                                std::istreambuf_iterator<char>());
        auto tokens = tokenizator_.tokenizeText(programText, keywords_);
        try
        {
            interpreter_.interpretateLines(tokens.begin(), tokens.end());
            os << interpreter_.getInterpretationResult()->eval(scope_) << std::endl;
        }
        catch (const std::exception &e)
        {
            os << e.what() << '\n';
        }
    }